

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_stopwatch_stop(REF_MPI ref_mpi,char *message)

{
  clock_t cVar1;
  double dVar2;
  
  cVar1 = clock();
  dVar2 = (double)cVar1 / 1000000.0 - ref_mpi->start_time;
  printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n",(double)cVar1 / 1000000.0 - ref_mpi->first_time,dVar2
         ,dVar2,0x405b800000000000,message);
  fflush(_stdout);
  cVar1 = clock();
  ref_mpi->start_time = (double)cVar1 / 1000000.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stopwatch_stop(REF_MPI ref_mpi,
                                          const char *message) {
#ifdef HAVE_MPI
  REF_DBL before_barrier, after_barrier, elapsed;
  REF_DBL first, last;
  before_barrier = (REF_DBL)MPI_Wtime() - ref_mpi->start_time;
  if (ref_mpi_para(ref_mpi)) MPI_Barrier(ref_mpi_comm(ref_mpi));
  after_barrier = (REF_DBL)MPI_Wtime();
  elapsed = after_barrier - ref_mpi->first_time;
  after_barrier = after_barrier - ref_mpi->start_time;
  RSS(ref_mpi_min(ref_mpi, &before_barrier, &first, REF_DBL_TYPE), "min");
  RSS(ref_mpi_min(ref_mpi, &after_barrier, &last, REF_DBL_TYPE), "max");
  if (ref_mpi_once(ref_mpi)) {
    printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n", elapsed, last, first,
           (last > 0.0 ? first / last * 100.0 : 100.0), message);
    fflush(stdout);
  }
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#else
  clock_t ticks;
  ticks = clock();
  printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n",
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->first_time,
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time,
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time,
         110.0, message);
  fflush(stdout);
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#endif

  return REF_SUCCESS;
}